

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O3

void __thiscall
CorUnix::CPalSynchronizationManager::UnRegisterWait
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,ThreadWaitInfo *ptwiWaitInfo,
          bool fHaveSharedLock)

{
  _WaitingThreadsListNode *pobj;
  bool bVar1;
  CSynchData *this_00;
  CSynchData *pCVar2;
  CSynchData *pCVar3;
  undefined7 in_register_00000009;
  long lVar4;
  
  if (((int)CONCAT71(in_register_00000009,fHaveSharedLock) == 0) &&
     (ptwiWaitInfo->wdWaitDomain != LocalWait)) {
    AcquireSharedSynchLock(pthrCurrent);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  if (PAL_InitializeChakraCoreCalled != true) {
    abort();
  }
  if (0 < ptwiWaitInfo->lObjCount) {
    lVar4 = 0;
    do {
      pobj = ptwiWaitInfo->rgpWTLNodes[lVar4];
      if ((pobj->dwFlags & 1) == 0) {
        this_00 = (pobj->ptrOwnerObjSynchData).ptr;
        pCVar3 = (CSynchData *)(pobj->ptrNext).ptr;
        pCVar2 = (CSynchData *)(pobj->ptrPrev).ptr;
        if ((CSynchData *)(pobj->ptrPrev).ptr == (CSynchData *)0x0) {
          pCVar2 = this_00;
        }
        (pCVar2->m_ptrWTLHead).ptr = (_WaitingThreadsListNode *)pCVar3;
        if (pCVar3 == (CSynchData *)0x0) {
          pCVar3 = this_00;
        }
        pCVar3->m_ptrWTLTail = pobj->ptrPrev;
        CSynchCache<CorUnix::_WaitingThreadsListNode>::Add
                  (&this->m_cacheWTListNodes,pthrCurrent,pobj);
      }
      else {
        this_00 = (CSynchData *)SHMPtrToPtr((pobj->ptrOwnerObjSynchData).shrid);
        pCVar2 = (CSynchData *)SHMPtrToPtr((pobj->ptrNext).shrid);
        pCVar3 = (CSynchData *)SHMPtrToPtr((pobj->ptrPrev).shrid);
        if (pCVar3 == (CSynchData *)0x0) {
          pCVar3 = this_00;
        }
        if (pCVar2 == (CSynchData *)0x0) {
          pCVar2 = this_00;
        }
        pCVar3->m_ptrWTLHead = pobj->ptrNext;
        pCVar2->m_ptrWTLTail = pobj->ptrPrev;
        CSHRSynchCache<CorUnix::_WaitingThreadsListNode>::Add
                  (&this->m_cacheSHRWTListNodes,pthrCurrent,pobj->shridSHRThis);
      }
      this_00->m_ulcWaitingThreads = this_00->m_ulcWaitingThreads - 1;
      CSynchData::Release(this_00,pthrCurrent);
      lVar4 = lVar4 + 1;
    } while (lVar4 < ptwiWaitInfo->lObjCount);
  }
  ptwiWaitInfo->lSharedObjCount = 0;
  ptwiWaitInfo->wdWaitDomain = LocalWait;
  ptwiWaitInfo->lObjCount = 0;
  if (bVar1) {
    ReleaseSharedSynchLock(pthrCurrent);
    return;
  }
  return;
}

Assistant:

void CPalSynchronizationManager::UnRegisterWait(
        CPalThread * pthrCurrent,
        ThreadWaitInfo * ptwiWaitInfo,
        bool fHaveSharedLock)
    {
        int i = 0;
        CSynchData * psdSynchData = NULL;
        bool fSharedSynchLock = false;

        if (!fHaveSharedLock && LocalWait != ptwiWaitInfo->wdWaitDomain)
        {
            AcquireSharedSynchLock(pthrCurrent);
            fSharedSynchLock = true;
        }

        TRACE("Unregistering wait for thread=%u [ObjCount=%d WaitType=%u WaitDomain=%u]\n",
              ptwiWaitInfo->pthrOwner->GetThreadId(),
              ptwiWaitInfo->lObjCount, ptwiWaitInfo->wtWaitType,
              ptwiWaitInfo->wdWaitDomain);

        for (i=0; i < ptwiWaitInfo->lObjCount; i++)
        {
            WaitingThreadsListNode * pwtlnItem = ptwiWaitInfo->rgpWTLNodes[i];

            VALIDATEOBJECT(pwtlnItem);

            if (pwtlnItem->dwFlags & WTLN_FLAG_OWNER_OBJECT_IS_SHARED)
            {
                // Shared object
                WaitingThreadsListNode * pwtlnItemNext, * pwtlnItemPrev;

                psdSynchData = SharedIDToTypePointer(CSynchData,
                    pwtlnItem->ptrOwnerObjSynchData.shrid);

                VALIDATEOBJECT(psdSynchData);

                pwtlnItemNext = SharedIDToTypePointer(WaitingThreadsListNode,
                    pwtlnItem->ptrNext.shrid);
                pwtlnItemPrev = SharedIDToTypePointer(WaitingThreadsListNode,
                    pwtlnItem->ptrPrev.shrid);
                if (pwtlnItemPrev)
                {
                    VALIDATEOBJECT(pwtlnItemPrev);
                    pwtlnItemPrev->ptrNext.shrid = pwtlnItem->ptrNext.shrid;
                }
                else
                {
                    psdSynchData->SetWTLHeadShrPtr(pwtlnItem->ptrNext.shrid);
                }
                if (pwtlnItemNext)
                {
                    VALIDATEOBJECT(pwtlnItemNext);
                    pwtlnItemNext->ptrPrev.shrid = pwtlnItem->ptrPrev.shrid;
                }
                else
                {
                    psdSynchData->SetWTLTailShrPtr(pwtlnItem->ptrPrev.shrid);
                }

                m_cacheSHRWTListNodes.Add(pthrCurrent, pwtlnItem->shridSHRThis);
            }
            else
            {
                // Local object
                psdSynchData = pwtlnItem->ptrOwnerObjSynchData.ptr;

                VALIDATEOBJECT(psdSynchData);

                if (pwtlnItem->ptrPrev.ptr)
                {
                    VALIDATEOBJECT(pwtlnItem);
                    pwtlnItem->ptrPrev.ptr->ptrNext.ptr = pwtlnItem->ptrNext.ptr;
                }
                else
                {
                    psdSynchData->SetWTLHeadPtr(pwtlnItem->ptrNext.ptr);
                }
                if (pwtlnItem->ptrNext.ptr)
                {
                    VALIDATEOBJECT(pwtlnItem);
                    pwtlnItem->ptrNext.ptr->ptrPrev.ptr = pwtlnItem->ptrPrev.ptr;
                }
                else
                {
                    psdSynchData->SetWTLTailPtr(pwtlnItem->ptrPrev.ptr);
                }

                m_cacheWTListNodes.Add(pthrCurrent, pwtlnItem);
            }

            // Release the node's refcount on the synch data, and decerement
            // waiting thread count
            psdSynchData->DecrementWaitingThreadCount();
            psdSynchData->Release(pthrCurrent);
        }

        // Reset wait data in ThreadWaitInfo structure: it is enough
        // to reset lObjCount, lSharedObjCount and wdWaitDomain.
        ptwiWaitInfo->lObjCount       = 0;
        ptwiWaitInfo->lSharedObjCount = 0;
        ptwiWaitInfo->wdWaitDomain    = LocalWait;

        // Done
        if (fSharedSynchLock)
        {
            ReleaseSharedSynchLock(pthrCurrent);
        }
        return;
    }